

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

unsigned_long __thiscall RPCHelpMan::Arg<unsigned_long>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  string_view key_00;
  uint64_t uVar2;
  RPCHelpMan *in_RSI;
  size_t in_RDI;
  long in_FS_OFFSET;
  size_t i;
  RPCHelpMan *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00._M_str = (char *)this;
  key_00._M_len = i;
  GetParamIndex(in_RSI,key_00);
  uVar2 = ArgValue<unsigned_long>(in_stack_ffffffffffffffc0,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }